

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall cnn::LookupParameters::clear(LookupParameters *this)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->non_zero_grads)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0
      ; p_Var1 = p_Var1->_M_nxt) {
    TensorTools::Zero((this->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                      _M_impl.super__Vector_impl_data._M_start + *(uint *)&p_Var1[1]._M_nxt);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->non_zero_grads)._M_h);
  return;
}

Assistant:

void LookupParameters::clear() {
  for (auto i : non_zero_grads)
    TensorTools::Zero(grads[i]);
  non_zero_grads.clear();
}